

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

Am_Constraint_Tag __thiscall Am_Slot::Add_Dependency(Am_Slot *this,Am_Constraint *new_dependency)

{
  int iVar1;
  undefined4 extraout_var;
  CItem *pCVar2;
  Am_Object_Context oc;
  undefined1 local_19;
  Am_Constraint *item;
  
  if (new_dependency != (Am_Constraint *)0x0) {
    iVar1 = (*(new_dependency->super_Am_Registered_Type)._vptr_Am_Registered_Type[0xd])
                      (new_dependency,this);
    item = (Am_Constraint *)CONCAT44(extraout_var,iVar1);
    if (item == (Am_Constraint *)0x0) {
      pCVar2 = (CItem *)0x0;
    }
    else {
      pCVar2 = am_CList::Add_Dep(&this->data->dependencies,item);
      if ((this->data->field_0x38 & 2) == 0) {
        local_19 = 0;
        (*(item->super_Am_Registered_Type)._vptr_Am_Registered_Type[9])(item,&local_19,this);
      }
    }
    return pCVar2;
  }
  slot_error("** (0L) dependency added to slot.\n",this->data);
}

Assistant:

Am_Constraint_Tag
Am_Slot::Add_Dependency(Am_Constraint *new_dependency) const
{
  if (!new_dependency)
    slot_error("** (0L) dependency added to slot.\n", data);
  new_dependency = new_dependency->Dependency_Added(*this);
  if (!new_dependency)
    // didn't want to be added
    return (Am_Constraint_Tag)nullptr;

  CItem *tag = data->dependencies.Add_Dep(new_dependency);
  if (!(data->flags & BIT_INHERITS)) {
    Am_Object_Context oc(false);
    new_dependency->Slot_Event(&oc, *this);
  }
  return (Am_Constraint_Tag)tag;
}